

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCompositeDeepScanLine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_86f4b::data<float>::setUpFrameBuffer
          (data<float> *this,vector<float,_std::allocator<float>_> *data,FrameBuffer *framebuf,
          Box2i *dw,bool dontbotherloadingdepth)

{
  int iVar1;
  int iVar2;
  _Alloc_hider _Var3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  pointer pbVar9;
  ulong uVar10;
  Slice local_68 [56];
  
  iVar4 = (dw->max).x;
  iVar1 = (dw->min).x;
  iVar2 = (dw->max).y;
  iVar7 = (dw->min).y;
  lVar8 = (long)((iVar4 - iVar1) + 1);
  if (iVar2 < iVar7 || iVar4 < iVar1) {
    lVar8 = 1;
  }
  lVar6 = (long)((iVar2 - iVar7) + 1);
  if (iVar2 < iVar7 || iVar4 < iVar1) {
    lVar6 = 1;
  }
  std::vector<float,_std::allocator<float>_>::resize
            (data,lVar8 * ((long)(this->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->_channels).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5) * lVar6);
  pbVar9 = (this->_channels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar9) {
    uVar10 = 0;
    do {
      if (dontbotherloadingdepth) {
        iVar4 = std::__cxx11::string::compare((char *)(pbVar9 + uVar10));
        if ((iVar4 != 0) &&
           (iVar4 = std::__cxx11::string::compare
                              ((char *)((this->_channels).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar10)),
           iVar4 != 0)) goto LAB_00136166;
      }
      else {
LAB_00136166:
        pbVar9 = (this->_channels).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var3._M_p = pbVar9[uVar10]._M_dataplus._M_p;
        iVar4 = (dw->min).x;
        iVar1 = (dw->min).y;
        iVar2 = (dw->max).x;
        iVar7 = (iVar2 - iVar4) + 1;
        lVar8 = (long)iVar7 * 4;
        if ((dw->max).y < iVar1 || iVar2 < iVar4) {
          iVar7 = 1;
          lVar8 = 4;
        }
        lVar6 = (long)(this->_channels).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9;
        uVar5 = lVar6 >> 3;
        Imf_3_4::Slice::Slice
                  (local_68,this->_type,
                   (char *)((long)(data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                  super__Vector_impl_data._M_start +
                           (uVar10 * 4 - (long)(iVar7 * iVar1 + iVar4) * uVar5)),uVar5,
                   (lVar6 >> 5) * lVar8,1,1,0.0,false,false);
        Imf_3_4::FrameBuffer::insert((char *)framebuf,(Slice *)_Var3._M_p);
      }
      uVar10 = uVar10 + 1;
      pbVar9 = (this->_channels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->_channels).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9 >> 5))
    ;
  }
  return;
}

Assistant:

void setUpFrameBuffer (
        vector<T>&   data,
        FrameBuffer& framebuf,
        const Box2i& dw,
        bool         dontbotherloadingdepth) const
    {

        // allocate enough space for all channels (even the depth channel)
        data.resize (
            _channels.size () * (dw.size ().x + 1) * (dw.size ().y + 1));
        for (size_t i = 0; i < _channels.size (); i++)
        {
            if (!dontbotherloadingdepth ||
                (_channels[i] != "Z" && _channels[i] != "ZBack"))
            {
                intptr_t base = reinterpret_cast<intptr_t> (&data[i]);
                framebuf.insert (
                    _channels[i].c_str (),
                    Slice (
                        _type,
                        reinterpret_cast<char*> (
                            base -
                            sizeof (T) *
                                (dw.min.x + dw.min.y * (dw.size ().x + 1)) *
                                _channels.size ()),
                        sizeof (T) * _channels.size (),
                        sizeof (T) * (dw.size ().x + 1) * _channels.size ()));
            }
        }
    }